

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.cpp
# Opt level: O1

void duckdb::AliasFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  size_type sVar1;
  pointer pcVar2;
  BoundFunctionExpression *pBVar3;
  const_reference this;
  pointer pEVar4;
  Value v;
  string local_70;
  Value local_50;
  
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  sVar1 = (state->expr->super_BaseExpression).alias._M_string_length;
  if (sVar1 == 0) {
    this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&pBVar3->children,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[7])(&local_70,pEVar4);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = (state->expr->super_BaseExpression).alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar2,pcVar2 + sVar1);
  }
  Value::Value(&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  Vector::Reference(result,&local_50);
  Value::~Value(&local_50);
  return;
}

Assistant:

static void AliasFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	Value v(state.expr.GetAlias().empty() ? func_expr.children[0]->GetName() : state.expr.GetAlias());
	result.Reference(v);
}